

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

char * __thiscall QListModel::index(QListModel *this,char *__s,int __c)

{
  char cVar1;
  uint in_ECX;
  
  cVar1 = QAbstractItemModel::hasIndex((int)__s,__c,(QModelIndex *)(ulong)in_ECX);
  if (cVar1 == '\0') {
    *(undefined8 *)&this->field_0x8 = 0;
    (this->items).d.d = (Data *)0x0;
    __c = -1;
    in_ECX = 0xffffffff;
  }
  else {
    *(undefined8 *)&this->field_0x8 = *(undefined8 *)(*(long *)(__s + 0x18) + (long)__c * 8);
    (this->items).d.d = (Data *)__s;
  }
  *(int *)this = __c;
  *(uint *)&this->field_0x4 = in_ECX;
  return (char *)this;
}

Assistant:

QModelIndex QListModel::index(int row, int column, const QModelIndex &parent) const
{
    if (hasIndex(row, column, parent))
        return createIndex(row, column, items.at(row));
    return QModelIndex();
}